

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_0::CreateInvalidDisplayTest::iterate(CreateInvalidDisplayTest *this)

{
  ostringstream *poVar1;
  EGLSyncKHR *value;
  EGLenum EVar2;
  TestLog *pTVar3;
  int iVar4;
  Library *pLVar5;
  undefined4 extraout_var;
  MessageBuilder *this_00;
  TestError *this_01;
  char *pcVar6;
  qpTestResult testResult;
  char *pcVar7;
  TestContext *this_02;
  Enum<int,_2UL> local_1c0;
  MessageBuilder local_1b0;
  
  pLVar5 = EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  pTVar3 = ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar4 = (*pLVar5->_vptr_Library[0x11])(pLVar5,0,(ulong)(this->super_SyncTest).m_syncType,0);
  value = &(this->super_SyncTest).m_sync;
  (this->super_SyncTest).m_sync = (EGLSyncKHR)CONCAT44(extraout_var,iVar4);
  local_1b0.m_log = pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
  this_00 = tcu::MessageBuilder::operator<<(&local_1b0,value);
  poVar1 = &this_00->m_str;
  std::operator<<((ostream *)poVar1," = eglCreateSyncKHR(EGL_NO_DISPLAY, ");
  EVar2 = (this->super_SyncTest).m_syncType;
  pcVar6 = "<Unknown>";
  if (EVar2 == 0x30fa) {
    pcVar6 = "EGL_SYNC_REUSABLE_KHR";
  }
  pcVar7 = "EGL_SYNC_FENCE_KHR";
  if (EVar2 != 0x30f9) {
    pcVar7 = pcVar6;
  }
  std::operator<<((ostream *)poVar1,pcVar7);
  std::operator<<((ostream *)poVar1,", NULL)");
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
  iVar4 = (*pLVar5->_vptr_Library[0x1f])(pLVar5);
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::ostream::operator<<(poVar1,iVar4);
  std::operator<<((ostream *)poVar1," = eglGetError()");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if (iVar4 == 0x3008) {
    if (*value != (EGLSyncKHR)0x0) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,(char *)0x0,"m_sync == EGL_NO_SYNC_KHR",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                 ,0x154);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    this_02 = (this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pcVar6 = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Unexpected error \'");
    local_1c0.m_getName = eglu::getErrorName;
    local_1c0.m_value = iVar4;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,"\' expected EGL_BAD_DISPLAY");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    this_02 = (this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pcVar6 = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult(this_02,testResult,pcVar6);
  return STOP;
}

Assistant:

IterateResult	iterate						(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		m_sync = egl.createSyncKHR(EGL_NO_DISPLAY, m_syncType, NULL);
		log << TestLog::Message << m_sync << " = eglCreateSyncKHR(EGL_NO_DISPLAY, " << getSyncTypeName(m_syncType) << ", NULL)" << TestLog::EndMessage;

		EGLint error = egl.getError();
		log << TestLog::Message << error << " = eglGetError()" << TestLog::EndMessage;

		if (error != EGL_BAD_DISPLAY)
		{
			log << TestLog::Message << "Unexpected error '" << eglu::getErrorStr(error) << "' expected EGL_BAD_DISPLAY" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		TCU_CHECK(m_sync == EGL_NO_SYNC_KHR);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}